

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O2

void pulse_prog_formian_queen(CHAR_DATA *mob)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  short sVar4;
  OBJ_AFFECT_DATA oaf;
  AFFECT_DATA af;
  
  if (mob->in_room != (ROOM_INDEX_DATA *)0x0) {
    if ((mob->fighting == (CHAR_DATA *)0x0) && (bVar1 = is_affected(mob,(int)gsn_timer), !bVar1)) {
      iVar2 = number_range(1,10);
      uVar3 = iVar2 - 1;
      if (uVar3 < 10) {
        sVar4 = *(short *)(&DAT_003f7570 + (ulong)uVar3 * 2);
        iVar2 = *(int *)(&DAT_003f7584 + (ulong)uVar3 * 4);
      }
      else {
        iVar2 = 0xc8c;
        sVar4 = 0;
      }
      pObjIndex = get_obj_index(iVar2);
      obj = create_object(pObjIndex,0);
      obj_to_room(obj,mob->in_room);
      init_affect(&af);
      af.where = 0;
      af.type = gsn_timer;
      af.duration = 0x14;
      af.aftype = 7;
      affect_to_char(mob,&af);
      init_affect_obj(&oaf);
      oaf.where = 0;
      oaf.type = gsn_timer;
      oaf.end_fun = formian_egg_hatch;
      oaf.duration = sVar4;
      oaf.aftype = 7;
      affect_to_obj(obj,&oaf);
    }
  }
  return;
}

Assistant:

void pulse_prog_formian_queen(CHAR_DATA *mob)
{
	int rand, vnum = 0, incubation = 0;
	AFFECT_DATA af;
	OBJ_AFFECT_DATA oaf;
	OBJ_DATA *egg;

	if (!mob->in_room)
		return;

	if (mob->fighting)
		return;

	if (is_affected(mob, gsn_timer))
		return;

	rand = number_range(1, 10);

	switch (rand)
	{
		case 1:
		case 2:
		case 3:
		case 4:
			vnum = 3212; // worker
			incubation = 35;
			break;
		case 5:
		case 6:
		case 7:
			vnum = 3213; // warrior
			incubation = 45;
			break;
		case 8:
		case 9:
			vnum = 3214; // taskmaster
			incubation = 55;
			break;
		case 10:
			vnum = 3215; // queen guard
			incubation = 65;
			break;
		default:
			vnum = 3212;
			break;
	}

	egg = create_object(get_obj_index(vnum), 0);
	obj_to_room(egg, mob->in_room);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.type = gsn_timer;
	af.duration = 20;
	affect_to_char(mob, &af);

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_AFFECTS;
	oaf.type = gsn_timer;
	oaf.aftype = AFT_TIMER;
	oaf.duration = incubation;
	oaf.end_fun = formian_egg_hatch;
	affect_to_obj(egg, &oaf);
}